

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderTextureImageSamplesGLSLExtensionRequireTest::
ShaderTextureImageSamplesGLSLExtensionRequireTest
          (ShaderTextureImageSamplesGLSLExtensionRequireTest *this,Context *context)

{
  Context *context_local;
  ShaderTextureImageSamplesGLSLExtensionRequireTest *this_local;
  
  ShaderTextureImageSamplesTestBase::ShaderTextureImageSamplesTestBase
            (&this->super_ShaderTextureImageSamplesTestBase,context,"glsl_extension_require",
             "Verifies a shader with \"#extension GL_ARB_shader_texture_image_samples : require\" line compiles without error."
            );
  (this->super_ShaderTextureImageSamplesTestBase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderTextureImageSamplesGLSLExtensionRequireTest_0324c1f0;
  return;
}

Assistant:

ShaderTextureImageSamplesGLSLExtensionRequireTest::ShaderTextureImageSamplesGLSLExtensionRequireTest(
	deqp::Context& context)
	: ShaderTextureImageSamplesTestBase(
		  context, "glsl_extension_require",
		  "Verifies a shader with \"#extension GL_ARB_shader_texture_image_samples : require\" "
		  "line compiles without error.")
{
	/* Left blank on purpose */
}